

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O2

int algo16_len(uchar *algo16)

{
  long lVar1;
  int algo16_len;
  int iVar2;
  ulong uVar3;
  
  uVar3 = 0x10;
  do {
    iVar2 = (int)uVar3;
    if (iVar2 == 0) {
      return 0;
    }
    lVar1 = uVar3 - 1;
    uVar3 = (ulong)(iVar2 - 1);
  } while (algo16[lVar1] == '\0');
  return iVar2;
}

Assistant:

static int algo16_len(const unsigned char *algo16) {
    int algo16_len = 16;

     /* Remove terminating null bytes */
     while (algo16_len > 0 && !algo16[algo16_len - 1]) {
        algo16_len--;
     }
     return algo16_len;
}